

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O2

void anurbs::Box<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Box<3l>,std::shared_ptr<anurbs::Box<3l>>> *this;
  string name;
  class_<anurbs::Box<3L>,_std::shared_ptr<anurbs::Box<3L>_>_> local_80;
  char *local_78 [4];
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  arg local_38;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::Box<3L>,_std::shared_ptr<anurbs::Box<3L>_>_>::class_<>
            (&local_80,(m->super_object).super_handle.m_ptr,local_78[0]);
  local_28.name = "a";
  local_28._8_1_ = 2;
  local_38.name = "b";
  local_38._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
  execute<pybind11::class_<anurbs::Box<3L>,_std::shared_ptr<anurbs::Box<3L>_>_>,_pybind11::arg,_pybind11::arg,_0>
            (&local_80,&local_28,&local_38);
  local_48 = Box<3L>::min;
  local_40 = 0;
  this = (class_<anurbs::Box<3l>,std::shared_ptr<anurbs::Box<3l>>> *)
         pybind11::class_<anurbs::Box<3l>,std::shared_ptr<anurbs::Box<3l>>>::
         def_property_readonly<Eigen::Ref<Eigen::Matrix<double,1,3,1,1,3>,0,Eigen::InnerStride<1>>(anurbs::Box<3l>::*)()>
                   ((class_<anurbs::Box<3l>,std::shared_ptr<anurbs::Box<3l>>> *)&local_80,"min",
                    (offset_in_Model_to_subr *)&local_48);
  local_58 = Box<3L>::max;
  local_50 = 0;
  pybind11::class_<anurbs::Box<3l>,std::shared_ptr<anurbs::Box<3l>>>::
  def_property_readonly<Eigen::Ref<Eigen::Matrix<double,1,3,1,1,3>,0,Eigen::InnerStride<1>>(anurbs::Box<3l>::*)()>
            (this,"max",(offset_in_Model_to_subr *)&local_58);
  pybind11::object::~object((object *)&local_80);
  Model::register_python_data_type<anurbs::Box<3l>>(m,model);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<Vector, Vector>(), "a"_a, "b"_a)
            // read-only properties
            .def_property_readonly("min", py::overload_cast<>(&Type::min))
            .def_property_readonly("max", py::overload_cast<>(&Type::max))
        ;

        Model::register_python_data_type<Type>(m, model);
    }